

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::DataManWriter::DoPutSync
          (DataManWriter *this,
          Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *variable,string *values)

{
  int commRank;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DataManWriter","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"PutSync","");
  commRank = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_50,&local_70,&local_90,&(variable->super_VariableBase).m_Name,0,commRank,5,
              this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  PutDeferredCommon<std::__cxx11::string>(this,variable,values);
  return;
}

Assistant:

void DataManWriter::DoClose(const int transportIndex)
{
    helper::Log("Engine", "DataManWriter", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    if (m_CombinedSteps < m_CombiningSteps && m_CombinedSteps > 0)
    {
        m_Serializer.AttachAttributesToLocalPack();
        const auto buffer = m_Serializer.GetLocalPack();
        if (buffer->size() > m_SerializerBufferSize)
        {
            m_SerializerBufferSize = buffer->size();
        }

        if (m_TransportMode == "reliable")
        {
            PushBufferQueue(buffer);
        }
        else if (m_TransportMode == "fast")
        {
            if (m_Threading)
            {
                PushBufferQueue(buffer);
            }
            else
            {
                m_Publisher.Send(buffer);
            }
        }
    }

    nlohmann::json endSignal;
    endSignal["FinalStep"] = static_cast<int64_t>(m_CurrentStep);
    std::string s = endSignal.dump() + '\0';
    auto cvp = std::make_shared<std::vector<char>>(s.size());
    std::memcpy(cvp->data(), s.c_str(), s.size());

    if (m_TransportMode == "reliable")
    {
        PushBufferQueue(cvp);
    }
    else if (m_TransportMode == "fast")
    {
        if (m_Threading)
        {
            while (!IsBufferQueueEmpty())
            {
            }
            for (int i = 0; i < 3; ++i)
            {
                PushBufferQueue(cvp);
                std::this_thread::sleep_for(std::chrono::milliseconds(10));
            }
        }
        else
        {
            for (int i = 0; i < 3; ++i)
            {
                m_Publisher.Send(cvp);
                std::this_thread::sleep_for(std::chrono::milliseconds(10));
            }
        }
    }

    if (m_ReplyThreadActive)
    {
        while (m_SentSteps < static_cast<size_t>(m_CurrentStep + 2))
        {
        }
        m_ReplyThreadActive = false;
    }
    if (m_ReplyThread.joinable())
    {
        m_ReplyThread.join();
    }

    m_PublishThreadActive = false;
    if (m_PublishThread.joinable())
    {
        m_PublishThread.join();
    }

    m_IsClosed = true;
}